

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O2

void equality_suite::compare_u32string_equal_map(void)

{
  size_type sVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  undefined1 local_ce;
  undefined1 local_cd;
  uint local_cc;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_c8;
  type local_98;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_68;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68.first,L"");
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_98.__data[0] =
       trial::dynamic::detail::
       operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
       ::equal(&local_68.first,(variable_type *)&local_c8);
  local_cc = local_cc & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == map::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc37,"void equality_suite::compare_u32string_equal_map()",&local_98,&local_cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68.first,L"");
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_98.__data[0] =
       trial::dynamic::operator!=
                 (&local_68.first,(basic_variable<std::allocator<char>_> *)&local_c8);
  local_cc._0_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != map::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc38,"void equality_suite::compare_u32string_equal_map()",&local_98,&local_cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68.first,L"delta");
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_98.__data[0] =
       trial::dynamic::detail::
       operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
       ::equal(&local_68.first,(variable_type *)&local_c8);
  local_cc._0_1_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == map::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc39,"void equality_suite::compare_u32string_equal_map()",&local_98,&local_cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68.first,L"delta");
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_98.__data[0] =
       trial::dynamic::operator!=
                 (&local_68.first,(basic_variable<std::allocator<char>_> *)&local_c8);
  local_cc = CONCAT31(local_cc._1_3_,1);
  sVar1 = 0xc3a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != map::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc3a,"void equality_suite::compare_u32string_equal_map()",&local_98,&local_cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_c8,L"");
  local_cc = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(&local_68,(char (*) [6])"delta",(int *)&local_cc);
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_98.__align,
             (basic_map<std::allocator<char>_> *)&local_68,init);
  local_cd = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
             ::equal((variable_type *)&local_c8,(variable_type *)&local_98.__align);
  local_ce = 0;
  sVar1 = 0xc3c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == map::make({ {\"delta\", 1} })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc3c,"void equality_suite::compare_u32string_equal_map()",&local_cd,&local_ce);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_98.__align);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_68);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_c8,L"");
  local_cc = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(&local_68,(char (*) [6])"delta",(int *)&local_cc);
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_98.__align,
             (basic_map<std::allocator<char>_> *)&local_68,init_00);
  local_cd = trial::dynamic::operator!=
                       ((basic_variable<std::allocator<char>_> *)&local_c8,
                        (basic_variable<std::allocator<char>_> *)&local_98.__align);
  local_ce = 1;
  sVar1 = 0xc3d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != map::make({ {\"delta\", 1} })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc3d,"void equality_suite::compare_u32string_equal_map()",&local_cd,&local_ce);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_98.__align);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_68);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_c8,L"delta");
  local_cc = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(&local_68,(char (*) [6])"delta",(int *)&local_cc);
  init_01._M_len = sVar1;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_98.__align,
             (basic_map<std::allocator<char>_> *)&local_68,init_01);
  local_cd = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
             ::equal((variable_type *)&local_c8,(variable_type *)&local_98.__align);
  local_ce = 0;
  sVar1 = 0xc3e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == map::make({ {\"delta\", 1} })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc3e,"void equality_suite::compare_u32string_equal_map()",&local_cd,&local_ce);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_98.__align);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_68);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_c8,L"delta");
  local_cc = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(&local_68,(char (*) [6])"delta",(int *)&local_cc);
  init_02._M_len = sVar1;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)&local_98.__align,
             (basic_map<std::allocator<char>_> *)&local_68,init_02);
  local_cd = trial::dynamic::operator!=
                       ((basic_variable<std::allocator<char>_> *)&local_c8,
                        (basic_variable<std::allocator<char>_> *)&local_98.__align);
  local_ce = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != map::make({ {\"delta\", 1} })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc3f,"void equality_suite::compare_u32string_equal_map()",&local_cd,&local_ce);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_98.__align);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_68);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  return;
}

Assistant:

void compare_u32string_equal_map()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == map::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != map::make(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == map::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != map::make(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == map::make({ {"delta", 1} }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != map::make({ {"delta", 1} }), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == map::make({ {"delta", 1} }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != map::make({ {"delta", 1} }), true);
}